

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tikz.cc
# Opt level: O3

bool lf::io::writeTikZ(Mesh *mesh,string *filename,
                      function<bool_(const_lf::mesh::Entity_&)> *selector,TikzOutputCtrl output_ctrl
                      )

{
  double *pdVar1;
  double *pdVar2;
  Entity *pEVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  size_type from;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MatrixXd *pMVar10;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar11;
  CoeffReturnType pdVar12;
  double *pdVar13;
  ostream *poVar14;
  undefined8 *puVar15;
  runtime_error *this;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long extraout_RDX;
  Mesh *pMVar20;
  char *pcVar21;
  long lVar22;
  double dVar23;
  double __tmp;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  RefEl obj_refel;
  MatrixXd scaled_vertices;
  MatrixXd vertices;
  MatrixXd semi_scaled_vertices;
  MatrixXd center_mat;
  DstEvaluatorType dstEvaluator;
  MatrixXd center;
  SrcEvaluatorType srcEvaluator;
  MatrixXd zero;
  stringstream ss;
  ofstream outfile;
  RefEl local_549;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_548;
  TikzOutputCtrl local_52c;
  Matrix<double,__1,__1,_0,__1,__1> local_528;
  scalar_product_op<double,_double> local_509;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_508;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_4e8;
  string local_4c8;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_4a8;
  Mesh *local_488;
  undefined8 local_480;
  double local_478;
  undefined8 uStack_470;
  undefined1 local_468 [44];
  uint local_43c;
  double local_438;
  undefined8 uStack_430;
  double local_428;
  undefined8 uStack_420;
  ulong local_418;
  undefined1 local_410 [16];
  Matrix<double,__1,__1,_0,__1,__1> local_400;
  Matrix<double,__1,__1,_0,__1,__1> local_3e8;
  ulong local_3d0;
  _Any_data *local_3c8;
  undefined8 *local_3c0;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  scalar_constant_op<double> local_398;
  scalar_constant_op<double> local_390;
  LhsNested local_388;
  variable_if_dynamic<long,__1> local_380;
  variable_if_dynamic<long,__1> local_378;
  scalar_constant_op<double> local_370;
  long local_230;
  filebuf local_228 [24];
  uint auStack_210 [54];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)filename,_S_out);
  uVar8 = *(uint *)((long)auStack_210 + *(long *)(local_230 + -0x18));
  if ((uVar8 & 5) == 0) {
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = (long *)0x1;
    local_3a8._M_allocated_capacity = 0;
    local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    local_488 = mesh;
    local_3c8 = (_Any_data *)selector;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
              (&local_3e8,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_3b8,(assign_op<double,_double> *)local_468);
    auVar25 = _DAT_0031d020;
    auVar26 = _DAT_0031d010;
    if (0 < local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows * local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols) {
      uVar16 = local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols + 0x1fffffffffffffff;
      uVar18 = uVar16 & 0x1fffffffffffffff;
      auVar24._8_4_ = (int)uVar18;
      auVar24._0_8_ = uVar18;
      auVar24._12_4_ = (int)(uVar18 >> 0x20);
      lVar19 = 0;
      auVar24 = auVar24 ^ _DAT_0031d020;
      do {
        auVar29._8_4_ = (int)lVar19;
        auVar29._0_8_ = lVar19;
        auVar29._12_4_ = (int)((ulong)lVar19 >> 0x20);
        auVar29 = (auVar29 | auVar26) ^ auVar25;
        bVar4 = auVar24._0_4_ < auVar29._0_4_;
        iVar6 = auVar24._4_4_;
        iVar9 = auVar29._4_4_;
        if ((bool)(~(iVar6 < iVar9 || iVar9 == iVar6 && bVar4) & 1)) {
          local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[lVar19] = (double)local_3a8._M_allocated_capacity;
        }
        if (iVar6 >= iVar9 && (iVar9 != iVar6 || !bVar4)) {
          local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[lVar19 + 1] = (double)local_3a8._M_allocated_capacity;
        }
        lVar19 = lVar19 + 2;
      } while ((uVar18 - ((uint)uVar16 & 1)) + 2 != lVar19);
    }
    iVar6 = (**local_488->_vptr_Mesh)();
    if (iVar6 != 2) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_3b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_3b8 + 0x10),"writeTikZ() only available for 2D meshes",0x28);
      local_468._0_8_ = local_468 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"dim_mesh == 2","");
      local_410._0_8_ = (LhsNested)(local_410 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_410,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_tikz.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_468,(string *)local_410,0x39,&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      if ((LhsNested)local_410._0_8_ != (LhsNested)(local_410 + 0x10)) {
        operator_delete((void *)local_410._0_8_,
                        (ulong)((long)local_400.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_data + 1));
      }
      if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
        operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"this code should not be reached");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar7 = (*local_488->_vptr_Mesh[3])(local_488,2);
    if ((output_ctrl & WithPreamble) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,
                 "\\documentclass[12pt,a4paper]{article}\n\\usepackage{tikz}\n\\begin{document}\n",
                 0x49);
      local_3b8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_3b8,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"% TikZ document graphics \n",0x1a);
    if (uVar7 < 0x33) {
      lVar19 = 0x4d;
      pcVar21 = "\\begin{tikzpicture}[scale=4, >= stealth, inner sep=0pt, minimum size=0.35cm]\n";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,
                 "\\begin{tikzpicture}[scale=6, >= stealth, inner sep=0pt, minimum size=0.2cm]\n",
                 0x4c);
      lVar19 = 0x24;
      pcVar21 = "\\tikzstyle{every node}=[font=\\tiny]\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar21,lVar19);
    uVar16 = 0;
    local_3d0 = (ulong)(output_ctrl >> 3 & 3);
    pMVar20 = local_488;
    local_52c = output_ctrl;
    local_43c = uVar8;
    do {
      local_418 = uVar16;
      iVar6 = (*pMVar20->_vptr_Mesh[2])(pMVar20);
      puVar15 = (undefined8 *)CONCAT44(extraout_var,iVar6);
      if (extraout_RDX != 0) {
        local_3c0 = puVar15 + extraout_RDX;
        do {
          if (*(long *)(local_3c8 + 1) == 0) {
            std::__throw_bad_function_call();
LAB_001d824c:
            puVar15 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar15 = execv;
            __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pEVar3 = (Entity *)*puVar15;
          bVar4 = (**(code **)((long)local_3c8 + 0x18))(local_3c8,pEVar3);
          if (!bVar4) goto LAB_001d8164;
          uVar8 = (*pMVar20->_vptr_Mesh[5])(pMVar20,pEVar3);
          iVar6 = (*pEVar3->_vptr_Entity[4])(pEVar3);
          local_549.type_ = (RefElType)iVar6;
          from = base::RefEl::NumNodes(&local_549);
          iVar6 = base::narrow<int,unsigned_int>(from);
          iVar9 = (*pEVar3->_vptr_Entity[3])(pEVar3);
          pMVar10 = base::RefEl::NodeCoords(&local_549);
          (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x18))
                    (&local_528,(long *)CONCAT44(extraout_var_00,iVar9),pMVar10);
          local_410._0_8_ =
               (undefined8)
               local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols;
          local_4e8.m_storage.m_data = (double *)&local_528;
          Eigen::
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
          ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            *)local_468,
                           local_528.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows,1,(scalar_constant_op<double> *)local_410);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)local_3b8,(Lhs *)&local_4e8,
                          (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           *)local_468,(scalar_quotient_op<double,_double> *)&local_4c8);
          local_4a8.m_storage.m_data = (double *)0x0;
          local_4a8.m_storage.m_rows = 0;
          local_4a8.m_storage.m_cols = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                    (&local_4a8,local_3a8._8_8_,1);
          local_468._8_8_ = local_3b8._8_8_;
          local_468._24_8_ = local_390.m_other;
          Eigen::internal::
          resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::internal::member_sum<double,double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,double,double>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&local_4a8,
                     (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_3b8,(assign_op<double,_double> *)&local_548);
          local_4c8._M_dataplus._M_p = (pointer)local_4a8.m_storage.m_data;
          local_4c8._M_string_length = local_4a8.m_storage.m_rows;
          local_410._0_8_ = &local_4c8;
          local_410._8_8_ = local_468;
          local_400.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)&local_548;
          local_400.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = (Index)&local_4a8;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)local_410);
          local_4e8.m_storage.m_data = (double *)0x0;
          local_4e8.m_storage.m_rows = 0;
          local_4e8.m_storage.m_cols = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                    (&local_4e8,local_4a8.m_storage.m_rows,(long)iVar6);
          pMVar20 = local_488;
          dVar23 = (double)(ulong)uVar8;
          switch(local_549.type_) {
          case kPoint:
            if ((local_52c & NodeNumbering) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"\\draw[red] (",0xc);
              pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,0,0);
              poVar14 = std::ostream::_M_insert<double>(*pdVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
              pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,1,0);
              poVar14 = std::ostream::_M_insert<double>(*pdVar12);
              lVar19 = 0xc;
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") ",2);
              pcVar21 = "node[] {*};\n";
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"\\draw[red, fill = white] (",0x1a);
              pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,0,0);
              poVar14 = std::ostream::_M_insert<double>(*pdVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
              pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,1,0);
              poVar14 = std::ostream::_M_insert<double>(*pdVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"node[draw, circle, fill = white] {",0x22);
              poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
              lVar19 = 3;
              pcVar21 = "};\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar21,lVar19);
            goto LAB_001d8143;
          case kSegment:
            Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3b8,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_4e8,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_4a8);
            Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3b8,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_4a8);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
                      ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3b8);
            local_4c8._M_dataplus._M_p = (pointer)0x3fe999999999999a;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              *)local_410,
                             local_528.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows,
                             local_528.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols,(scalar_constant_op<double> *)&local_4c8);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_468,&local_528,(Rhs *)local_410,
                            (scalar_product_op<double,_double> *)&local_508);
            local_508.m_storage.m_data = (double *)0x3fc999999999999a;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              *)&local_4c8,local_4e8.m_storage.m_rows,local_4e8.m_storage.m_cols,
                             (scalar_constant_op<double> *)&local_508);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_410,(Lhs *)&local_4e8,(Rhs *)&local_4c8,
                            (scalar_product_op<double,_double> *)&local_480);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                             *)local_3b8,(Lhs *)local_468,
                            (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_410,(scalar_sum_op<double,_double> *)&local_4c8);
            local_548.m_storage.m_data = (double *)0x0;
            local_548.m_storage.m_rows = 0;
            local_548.m_storage.m_cols = 0;
            if ((local_378.m_value != 0 && local_380.m_value != 0) &&
               (local_438 = dVar23,
               SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                      SEXT816(local_378.m_value),0) < local_380.m_value)) goto LAB_001d824c;
            local_438 = dVar23;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                      (&local_548,local_380.m_value,local_378.m_value);
            lVar19 = *(long *)local_3b8._8_8_;
            local_478 = local_398.m_other;
            uStack_470 = 0;
            pdVar13 = (local_388->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data;
            local_428 = local_370.m_other;
            uStack_420 = 0;
            Eigen::internal::
            resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,double,double>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)&local_548,
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                        *)local_3b8,(assign_op<double,_double> *)&local_4c8);
            lVar17 = local_548.m_storage.m_cols * local_548.m_storage.m_rows;
            uVar16 = lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < lVar17) {
              lVar22 = 0;
              do {
                pdVar2 = (double *)(lVar19 + lVar22 * 8);
                pdVar1 = pdVar13 + lVar22;
                auVar27._0_8_ = *pdVar1 * local_428 + *pdVar2 * local_478;
                auVar27._8_8_ = pdVar1[1] * local_428 + pdVar2[1] * local_478;
                *(undefined1 (*) [16])(local_548.m_storage.m_data + lVar22) = auVar27;
                lVar22 = lVar22 + 2;
              } while (lVar22 < (long)uVar16);
            }
            if ((long)uVar16 < lVar17) {
              do {
                local_548.m_storage.m_data[uVar16] =
                     pdVar13[uVar16] * local_428 + *(double *)(lVar19 + uVar16 * 8) * local_478;
                uVar16 = uVar16 + 1;
              } while (lVar17 - uVar16 != 0);
            }
            local_4c8._M_dataplus._M_p = (pointer)0x3fee666666666666;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              *)local_410,
                             local_528.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows,
                             local_528.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols,(scalar_constant_op<double> *)&local_4c8);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_468,&local_528,(Rhs *)local_410,
                            (scalar_product_op<double,_double> *)&local_480);
            local_480 = 0x3fa999999999999a;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              *)&local_4c8,local_4e8.m_storage.m_rows,local_4e8.m_storage.m_cols,
                             (scalar_constant_op<double> *)&local_480);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_410,(Lhs *)&local_4e8,(Rhs *)&local_4c8,&local_509);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                             *)local_3b8,(Lhs *)local_468,
                            (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_410,(scalar_sum_op<double,_double> *)&local_4c8);
            local_508.m_storage.m_data = (double *)0x0;
            local_508.m_storage.m_rows = 0;
            local_508.m_storage.m_cols = 0;
            if ((local_378.m_value != 0 && local_380.m_value != 0) &&
               (auVar26 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
               SUB168(auVar26 / SEXT816(local_378.m_value),0) < local_380.m_value)) {
              puVar15 = (undefined8 *)
                        __cxa_allocate_exception
                                  (8,local_380.m_value,
                                   SUB168(auVar26 % SEXT816(local_378.m_value),0));
              *puVar15 = execv;
              __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                      (&local_508,local_380.m_value,local_378.m_value);
            lVar19 = *(long *)local_3b8._8_8_;
            local_478 = local_398.m_other;
            uStack_470 = 0;
            pdVar13 = (local_388->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data;
            local_428 = local_370.m_other;
            uStack_420 = 0;
            Eigen::internal::
            resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,double,double>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)&local_508,
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                        *)local_3b8,(assign_op<double,_double> *)&local_4c8);
            lVar17 = local_508.m_storage.m_cols * local_508.m_storage.m_rows;
            uVar16 = lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < lVar17) {
              lVar22 = 0;
              do {
                pdVar2 = (double *)(lVar19 + lVar22 * 8);
                pdVar1 = pdVar13 + lVar22;
                auVar28._0_8_ = *pdVar1 * local_428 + *pdVar2 * local_478;
                auVar28._8_8_ = pdVar1[1] * local_428 + pdVar2[1] * local_478;
                *(undefined1 (*) [16])(local_508.m_storage.m_data + lVar22) = auVar28;
                lVar22 = lVar22 + 2;
              } while (lVar22 < (long)uVar16);
            }
            if ((long)uVar16 < lVar17) {
              do {
                local_508.m_storage.m_data[uVar16] =
                     pdVar13[uVar16] * local_428 + *(double *)(lVar19 + uVar16 * 8) * local_478;
                uVar16 = uVar16 + 1;
              } while (lVar17 - uVar16 != 0);
            }
            if ((local_52c & ArrowTips) != 0) {
              uVar5 = (*(code *)(&DAT_0032d434 + *(int *)(&DAT_0032d434 + local_3d0 * 4)))();
              return (bool)uVar5;
            }
            if ((local_52c & EdgeNumbering) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"\\draw[] (",9);
              pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,0,0);
              poVar14 = std::ostream::_M_insert<double>(*pdVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
              pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,1,0);
              poVar14 = std::ostream::_M_insert<double>(*pdVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") -- ",5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(",1);
              pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,0,1);
              poVar14 = std::ostream::_M_insert<double>(*pdVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
              pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,1,1);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_230,"\\draw[] (",9);
              pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,0,0);
              poVar14 = std::ostream::_M_insert<double>(*pdVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
              pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,1,0);
              poVar14 = std::ostream::_M_insert<double>(*pdVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") -- node[black] {",0x12);
              poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"} ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(",1);
              pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,0,1);
              poVar14 = std::ostream::_M_insert<double>(*pdVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
              pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_528,1,1);
            }
            poVar14 = std::ostream::_M_insert<double>(*pdVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,");\n",3);
            free(local_508.m_storage.m_data);
            break;
          case kTria:
            Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3b8,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_4e8,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_4a8);
            pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                                ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3b8,
                                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_4a8)
            ;
            Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar11,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_4a8);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
                      ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3b8);
            local_4c8._M_dataplus._M_p = (pointer)0x3fe6666666666666;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              *)local_410,
                             local_528.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows,
                             local_528.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols,(scalar_constant_op<double> *)&local_4c8);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_468,&local_528,(Rhs *)local_410,
                            (scalar_product_op<double,_double> *)&local_508);
            local_508.m_storage.m_data = (double *)0x3fd3333333333333;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              *)&local_4c8,local_4e8.m_storage.m_rows,local_4e8.m_storage.m_cols,
                             (scalar_constant_op<double> *)&local_508);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_410,(Lhs *)&local_4e8,(Rhs *)&local_4c8,
                            (scalar_product_op<double,_double> *)&local_480);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                             *)local_3b8,(Lhs *)local_468,
                            (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_410,(scalar_sum_op<double,_double> *)&local_4c8);
            local_548.m_storage.m_data = (double *)0x0;
            local_548.m_storage.m_rows = 0;
            local_548.m_storage.m_cols = 0;
            if ((local_378.m_value != 0 && local_380.m_value != 0) &&
               (auVar26 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
               SUB168(auVar26 / SEXT816(local_378.m_value),0) < local_380.m_value)) {
              puVar15 = (undefined8 *)
                        __cxa_allocate_exception
                                  (8,local_380.m_value,
                                   SUB168(auVar26 % SEXT816(local_378.m_value),0));
              *puVar15 = execv;
              __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                      (&local_548,local_380.m_value,local_378.m_value);
            lVar19 = *(long *)local_3b8._8_8_;
            local_438 = local_398.m_other;
            uStack_430 = 0;
            pdVar13 = (local_388->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data;
            local_478 = local_370.m_other;
            uStack_470 = 0;
            Eigen::internal::
            resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,double,double>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)&local_548,
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                        *)local_3b8,(assign_op<double,_double> *)&local_4c8);
            lVar17 = local_548.m_storage.m_cols * local_548.m_storage.m_rows;
            uVar16 = lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < lVar17) {
              lVar22 = 0;
              do {
                pdVar2 = (double *)(lVar19 + lVar22 * 8);
                pdVar1 = pdVar13 + lVar22;
                auVar25._0_8_ = *pdVar1 * local_478 + *pdVar2 * local_438;
                auVar25._8_8_ = pdVar1[1] * local_478 + pdVar2[1] * local_438;
                *(undefined1 (*) [16])(local_548.m_storage.m_data + lVar22) = auVar25;
                lVar22 = lVar22 + 2;
              } while (lVar22 < (long)uVar16);
            }
            if ((long)uVar16 < lVar17) {
              do {
                local_548.m_storage.m_data[uVar16] =
                     pdVar13[uVar16] * local_478 + *(double *)(lVar19 + uVar16 * 8) * local_438;
                uVar16 = uVar16 + 1;
              } while (lVar17 - uVar16 != 0);
            }
            if ((local_52c & RenderCells) != 0) {
              if ((local_52c & VerticeNumbering) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"\\draw[green] (",0xe);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") -- (",6);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,1);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,1);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") -- (",6);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,2);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,2);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                lVar19 = 0xc;
                pcVar21 = ") -- cycle;\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"\\draw[green] (",0xe);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") node[] {0} -- (",0x11)
                ;
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,1);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,1);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") node[] {1} -- (",0x11)
                ;
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,2);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,2);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                lVar19 = 0x17;
                pcVar21 = ") node[] {2} -- cycle;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar21,lVar19);
              if ((local_52c & CellNumbering) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"\\draw[green] (",0xe);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_4a8,0,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_4a8,1,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") node[] {",10);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"};\n",3);
              }
            }
            break;
          case kQuad:
            Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3b8,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_4e8,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_4a8);
            pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                                ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3b8,
                                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_4a8)
            ;
            pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                                ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar11,
                                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_4a8)
            ;
            Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar11,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_4a8);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
                      ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3b8);
            local_4c8._M_dataplus._M_p = (pointer)0x3fe6666666666666;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              *)local_410,
                             local_528.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows,
                             local_528.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols,(scalar_constant_op<double> *)&local_4c8);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_468,&local_528,(Rhs *)local_410,
                            (scalar_product_op<double,_double> *)&local_508);
            local_508.m_storage.m_data = (double *)0x3fd3333333333333;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
            ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              *)&local_4c8,local_4e8.m_storage.m_rows,local_4e8.m_storage.m_cols,
                             (scalar_constant_op<double> *)&local_508);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_410,(Lhs *)&local_4e8,(Rhs *)&local_4c8,
                            (scalar_product_op<double,_double> *)&local_480);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                             *)local_3b8,(Lhs *)local_468,
                            (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_410,(scalar_sum_op<double,_double> *)&local_4c8);
            local_548.m_storage.m_data = (double *)0x0;
            local_548.m_storage.m_rows = 0;
            local_548.m_storage.m_cols = 0;
            if ((local_378.m_value != 0 && local_380.m_value != 0) &&
               (auVar26 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
               SUB168(auVar26 / SEXT816(local_378.m_value),0) < local_380.m_value)) {
              local_438 = dVar23;
              puVar15 = (undefined8 *)
                        __cxa_allocate_exception
                                  (8,local_380.m_value,
                                   SUB168(auVar26 % SEXT816(local_378.m_value),0));
              *puVar15 = execv;
              __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            local_438 = dVar23;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                      (&local_548,local_380.m_value,local_378.m_value);
            lVar19 = *(long *)local_3b8._8_8_;
            local_478 = local_398.m_other;
            uStack_470 = 0;
            pdVar13 = (local_388->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data;
            local_428 = local_370.m_other;
            uStack_420 = 0;
            Eigen::internal::
            resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>,double,double>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)&local_548,
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                        *)local_3b8,(assign_op<double,_double> *)&local_4c8);
            lVar17 = local_548.m_storage.m_cols * local_548.m_storage.m_rows;
            uVar16 = lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < lVar17) {
              lVar22 = 0;
              do {
                pdVar2 = (double *)(lVar19 + lVar22 * 8);
                pdVar1 = pdVar13 + lVar22;
                auVar26._0_8_ = *pdVar1 * local_428 + *pdVar2 * local_478;
                auVar26._8_8_ = pdVar1[1] * local_428 + pdVar2[1] * local_478;
                *(undefined1 (*) [16])(local_548.m_storage.m_data + lVar22) = auVar26;
                lVar22 = lVar22 + 2;
              } while (lVar22 < (long)uVar16);
            }
            if ((long)uVar16 < lVar17) {
              do {
                local_548.m_storage.m_data[uVar16] =
                     pdVar13[uVar16] * local_428 + *(double *)(lVar19 + uVar16 * 8) * local_478;
                uVar16 = uVar16 + 1;
              } while (lVar17 - uVar16 != 0);
            }
            if ((local_52c & RenderCells) != 0) {
              if ((local_52c & VerticeNumbering) == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"\\draw[magenta] (",0x10);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") -- (",6);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,1);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,1);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") -- (",6);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,2);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,2);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") -- (",6);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,3);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,3);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                lVar19 = 0xc;
                pcVar21 = ") -- cycle;\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"\\draw[magenta] (",0x10);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") node[] {0} -- (",0x11)
                ;
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,1);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,1);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") node[] {1} -- (",0x11)
                ;
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,2);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,2);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") node[] {2} -- (",0x11)
                ;
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,0,3);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_548,1,3);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                lVar19 = 0x17;
                pcVar21 = ") node[] {3} -- cycle;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar21,lVar19);
              if ((local_52c & CellNumbering) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,"\\draw[magenta] (",0x10);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_4a8,0,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
                pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_4a8,1,0);
                poVar14 = std::ostream::_M_insert<double>(*pdVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,") node[] {",10);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"};\n",3);
              }
            }
            break;
          default:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error for object ",0x11);
            poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," in co-dim ",0xb);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)local_418);
            local_3b8[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_3b8,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Object type: ",0xd);
            base::RefEl::ToString_abi_cxx11_((string *)local_3b8,&local_549);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)local_3b8._0_8_,local_3b8._8_8_);
            if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
              operator_delete((void *)local_3b8._0_8_,local_3a8._M_allocated_capacity + 1);
            }
            local_3b8[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_3b8,1);
            goto LAB_001d8143;
          }
          free(local_548.m_storage.m_data);
LAB_001d8143:
          free(local_4e8.m_storage.m_data);
          free(local_4a8.m_storage.m_data);
          free(local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
LAB_001d8164:
          puVar15 = puVar15 + 1;
        } while (puVar15 != local_3c0);
      }
      uVar8 = (int)local_418 + 1;
      uVar16 = (ulong)uVar8;
    } while (uVar8 != 3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"\\end{tikzpicture}\n",0x12);
    uVar8 = local_43c;
    if ((local_52c & WithPreamble) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"\n\\end{document}",0xf);
      local_3b8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_3b8,1);
    }
    free(local_3e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return (uVar8 & 5) == 0;
}

Assistant:

bool writeTikZ(const lf::mesh::Mesh &mesh, const std::string &filename,
               std::function<bool(const lf::mesh::Entity &)> &&selector,
               TikzOutputCtrl output_ctrl) {
  // Open output file for writing and quit in case of failure
  std::ofstream outfile(filename);
  if (!outfile) {
    return false;
  }
  // ----------------------------------------------------------------
  // For the enum flags: TikzOutputCtrl
  // NOLINTBEGIN(bugprone-non-zero-enum-to-bool-conversion)
  const bool EdgeNumOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::EdgeNumbering);
  const bool NodeNumOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::NodeNumbering);
  const bool CellNumOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::CellNumbering);
  const bool VerticeNumOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::VerticeNumbering);
  const bool RenderCellsOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::RenderCells);
  const bool ArrowsOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::ArrowTips);
  const bool WithPreamble =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::WithPreamble);
  // NOLINTEND(bugprone-non-zero-enum-to-bool-conversion)

  using size_type = std::size_t;         // lf::base::size_type;
  using dim_t = lf::base::RefEl::dim_t;  // lf::base::dim_t;
  const Eigen::MatrixXd zero(Eigen::MatrixXd::Zero(0, 1));

  // Obtain topological dimension of the mesh
  const dim_t dim_mesh = mesh.DimMesh();
  LF_VERIFY_MSG(dim_mesh == 2, "writeTikZ() only available for 2D meshes");

  // Run through nodes
  const dim_t node_codim(dim_mesh);  // Codimension number for nodes in the mesh
  const size_type no_of_nodes =
      mesh.NumEntities(node_codim);  // No. of nodes in codimension for nodes
  size_type node_count = 0;

  // START writing to file
  if (WithPreamble) {
    outfile << "\\documentclass[12pt,a4paper]{article}\n\\usepackage{tikz}"
               "\n\\begin{document}\n"
            << '\n';
  }
  outfile << "% TikZ document graphics \n";

  // Scale font size for large meshes
  if (no_of_nodes > 50) {
    outfile << "\\begin{tikzpicture}[scale=6, >= stealth, inner sep=0pt, "
               "minimum size=0.2cm]\n";
    outfile << "\\tikzstyle{every node}=[font=\\tiny]\n";
  } else {
    outfile << "\\begin{tikzpicture}[scale=4, >= stealth, inner sep=0pt, "
               "minimum size=0.35cm]\n";
  }

  // ---------------------------------------------------------------------------

  // Loop through codimensions
  for (int co_dim = 0; co_dim <= dim_mesh; co_dim++) {
    // Loop through all types of entities
    for (const mesh::Entity *obj : mesh.Entities(co_dim)) {
      if (selector(*obj)) {  // IF SELECTOR -------
        const size_type obj_idx = mesh.Index(*obj);
        const lf::base::RefEl obj_refel = obj->RefEl();
        const int num_nodes_obj = base::narrow<int>(obj_refel.NumNodes());
        const geometry::Geometry *obj_geo_ptr = obj->Geometry();
        const Eigen::MatrixXd &obj_corners(obj_refel.NodeCoords());
        const Eigen::MatrixXd vertices = obj_geo_ptr->Global(obj_corners);
        const Eigen::MatrixXd center =
            vertices.rowwise().sum() / vertices.cols();
        Eigen::MatrixXd center_mat(center.rows(), num_nodes_obj);

        switch (obj_refel) {
          case lf::base::RefEl::kPoint(): {
            if (NodeNumOn) {
              outfile << "\\draw[red, fill = white] (" << vertices(0, 0) << ","
                      << vertices(1, 0) << ") "
                      << "node[draw, circle, fill = white] {" << obj_idx
                      << "};\n";
            } else {
              outfile << "\\draw[red] (" << vertices(0, 0) << ","
                      << vertices(1, 0) << ") " << "node[] {*};\n";
            }  // if NodeNumOn
            break;

          }  // case kPoint

          case lf::base::RefEl::kSegment(): {
            center_mat << center, center;
            const Eigen::MatrixXd scaled_vertices =
                vertices * 0.80 + center_mat * 0.2;
            const Eigen::MatrixXd semi_scaled_vertices =
                vertices * 0.95 + center_mat * 0.05;

            if (ArrowsOn) {
              if (EdgeNumOn && NodeNumOn) {
                outfile << "\\draw[->] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") -- node[black] {"
                        << obj_idx << "} " << "(" << scaled_vertices(0, 1)
                        << "," << scaled_vertices(1, 1) << ");\n";
              } else if (NodeNumOn && !EdgeNumOn) {
                outfile << "\\draw[->] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") -- " << "("
                        << scaled_vertices(0, 1) << "," << scaled_vertices(1, 1)
                        << ");\n";
              } else if (!NodeNumOn && EdgeNumOn) {
                outfile << "\\draw[->] (" << semi_scaled_vertices(0, 0) << ","
                        << semi_scaled_vertices(1, 0) << ") -- node[black] {"
                        << obj_idx << "} " << "(" << semi_scaled_vertices(0, 1)
                        << "," << semi_scaled_vertices(1, 1) << ");\n";
              } else if (!NodeNumOn && !EdgeNumOn) {
                outfile << "\\draw[->] (" << semi_scaled_vertices(0, 0) << ","
                        << semi_scaled_vertices(1, 0) << ") -- " << "("
                        << semi_scaled_vertices(0, 1) << ","
                        << semi_scaled_vertices(1, 1) << ");\n";
              } else {
                std::cout << "Check EdgeNumOn and NodeNumOn for kSegment "
                          << obj_idx << '\n';
              }

            } else {
              if (EdgeNumOn) {
                outfile << "\\draw[] (" << vertices(0, 0) << ","
                        << vertices(1, 0) << ") -- node[black] {" << obj_idx
                        << "} " << "(" << vertices(0, 1) << ","
                        << vertices(1, 1) << ");\n";
              } else if (!EdgeNumOn) {
                outfile << "\\draw[] (" << vertices(0, 0) << ","
                        << vertices(1, 0) << ") -- " << "(" << vertices(0, 1)
                        << "," << vertices(1, 1) << ");\n";
              } else {
                std::cout << "Check EdgeNumOn and NodeNumOn for kSegment "
                          << obj_idx << '\n';
              }
            }  // arrows on

            break;
          }  // case kSegment

          case lf::base::RefEl::kTria(): {
            center_mat << center, center, center;
            const Eigen::MatrixXd scaled_vertices =
                vertices * 0.70 + center_mat * 0.30;

            if (RenderCellsOn) {
              if (VerticeNumOn) {
                outfile << "\\draw[green] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") node[] {0} -- ("
                        << scaled_vertices(0, 1) << "," << scaled_vertices(1, 1)
                        << ") node[] {1} -- (" << scaled_vertices(0, 2) << ","
                        << scaled_vertices(1, 2) << ") node[] {2} -- cycle;\n";
              } else {
                outfile << "\\draw[green] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") -- ("
                        << scaled_vertices(0, 1) << "," << scaled_vertices(1, 1)
                        << ") -- (" << scaled_vertices(0, 2) << ","
                        << scaled_vertices(1, 2) << ") -- cycle;\n";
              }  // if EdgeNumOn

              if (CellNumOn) {
                outfile << "\\draw[green] (" << center(0, 0) << ","
                        << center(1, 0) << ") node[] {" << obj_idx << "};\n";
              }

            }  // RenderCellsOn
            break;
          }  // case kTria

          case lf::base::RefEl::kQuad(): {
            center_mat << center, center, center, center;
            const Eigen::MatrixXd scaled_vertices =
                vertices * 0.70 + center_mat * 0.3;

            if (RenderCellsOn) {
              if (VerticeNumOn) {
                outfile << "\\draw[magenta] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") node[] {0} -- ("
                        << scaled_vertices(0, 1) << "," << scaled_vertices(1, 1)
                        << ") node[] {1} -- (" << scaled_vertices(0, 2) << ","
                        << scaled_vertices(1, 2) << ") node[] {2} -- ("
                        << scaled_vertices(0, 3) << "," << scaled_vertices(1, 3)
                        << ") node[] {3} -- cycle;\n";
              } else {
                outfile << "\\draw[magenta] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") -- ("
                        << scaled_vertices(0, 1) << "," << scaled_vertices(1, 1)
                        << ") -- (" << scaled_vertices(0, 2) << ","
                        << scaled_vertices(1, 2) << ") -- ("
                        << scaled_vertices(0, 3) << "," << scaled_vertices(1, 3)
                        << ") -- cycle;\n";
              }

              if (CellNumOn) {
                outfile << "\\draw[magenta] (" << center(0, 0) << ","
                        << center(1, 0) << ") node[] {" << obj_idx << "};\n";
              }

            }  // RenderCellsOn

            break;
          }  // case kQuad

          default: {
            std::cout << "Error for object " << obj_idx << " in co-dim "
                      << co_dim << '\n';
            std::cout << "Object type: " << obj_refel << '\n';
            break;
          }  // default
        }  // switch
      }  // IF SELECTOR --------------------
    }  // for entities

    node_count++;
    // LF_VERIFY_MSG(node_count == no_of_nodes, "Node count mismatch");
  }  // for codim

  outfile << "\\end{tikzpicture}\n";
  if (WithPreamble) {
    outfile << "\n\\end{document}" << '\n';
  }
  return true;
}